

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

void unprepare_permutation_ntk(saucy *s)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  uint uVar3;
  Nm_Man_t *pNVar4;
  void **ppvVar5;
  char *pName;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  Abc_Ntk_t *pAVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = s->pNtk->vPos->nSize;
  lVar10 = (long)iVar1;
  Nm_ManFree(s->pNtk_permuted->pManName);
  pAVar8 = s->pNtk;
  pNVar4 = Nm_ManCreate(pAVar8->vCos->nSize + pAVar8->vCis->nSize + pAVar8->vBoxes->nSize);
  pAVar8 = s->pNtk_permuted;
  pAVar8->pManName = pNVar4;
  if (0 < s->n) {
    lVar9 = 0;
    do {
      uVar3 = s->gamma[lVar9];
      lVar6 = lVar9 - lVar10;
      if (lVar9 < lVar10) {
        if ((((int)uVar3 < 0) || (pVVar2 = s->pNtk->vPos, pVVar2->nSize <= (int)uVar3)) ||
           (pVVar7 = s->pNtk_permuted->vPos, pVVar7->nSize <= lVar9)) {
LAB_00309bac:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar5 = pVVar2->pArray + uVar3;
        lVar6 = lVar9;
      }
      else {
        uVar3 = uVar3 - iVar1;
        if (((((int)uVar3 < 0) || (pVVar2 = s->pNtk->vPis, pVVar2->nSize <= (int)uVar3)) ||
            (lVar9 - lVar10 < 0)) ||
           (pVVar7 = s->pNtk_permuted->vPis, (long)pVVar7->nSize <= lVar9 - lVar10))
        goto LAB_00309bac;
        ppvVar5 = pVVar2->pArray + uVar3;
      }
      pObj = (Abc_Obj_t *)pVVar7->pArray[lVar6];
      pName = Abc_ObjName((Abc_Obj_t *)*ppvVar5);
      Abc_ObjAssignName(pObj,pName,(char *)0x0);
      lVar9 = lVar9 + 1;
    } while (lVar9 < s->n);
    pAVar8 = s->pNtk_permuted;
  }
  Abc_NtkOrderObjsByName(pAVar8,1);
  return;
}

Assistant:

void
unprepare_permutation_ntk(struct saucy *s) 
{       
    int i;
    Abc_Obj_t * pObj, * pObjPerm;
    int numouts = Abc_NtkPoNum(s->pNtk);

    Nm_ManFree( s->pNtk_permuted->pManName );
    s->pNtk_permuted->pManName = Nm_ManCreate( Abc_NtkCiNum(s->pNtk) + Abc_NtkCoNum(s->pNtk) + Abc_NtkBoxNum(s->pNtk) );    

    for (i = 0; i < s->n; ++i) {        
        if (i < numouts) {
            pObj     = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPos, s->gamma[i]);
            pObjPerm = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk_permuted->vPos, i);         
        }
        else {          
            pObj     = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPis, s->gamma[i] - numouts);
            pObjPerm = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk_permuted->vPis, i - numouts);
            
        }
        Abc_ObjAssignName( pObjPerm, Abc_ObjName(pObj), NULL );         
    }

    Abc_NtkOrderObjsByName( s->pNtk_permuted, 1 );
}